

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O2

size_t mjs::test_spec_runner::run
                 (gc_heap *h,vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *specs,
                 block_statement *statements)

{
  test_spec_runner tsr;
  value local_a0;
  test_spec_runner local_78;
  
  test_spec_runner(&local_78,h,specs,statements);
  interpreter::eval(&local_a0,&local_78.i_,&statements->super_statement);
  value::~value(&local_a0);
  check_test_spec_done(&local_78,(statements->super_statement).super_syntax_node.extend_.end);
  ~test_spec_runner(&local_78);
  return local_78.index_;
}

Assistant:

static size_t run(gc_heap& h, const std::vector<test_spec>& specs, const block_statement& statements) {
#ifdef TEST_SPEC_DEBUG
        std::wcout << "Running test spec for " << statements.extend().file->text() << "\n";
        std::wcout << "Parsed:\n";
        print(std::wcout, statements);
        std::wcout << "Specs:\n";
        for (const auto& s: specs) {
            std::wcout << pos_w << s.position << " " << s.expected.type() << " " << to_string(h, s.expected) << "\n";
        }
        std::wcout << "\n";
#endif
        test_spec_runner tsr{h, specs, statements};
        tsr.i_.eval(statements);
        tsr.check_test_spec_done(statements.extend().end);
#ifdef TEST_SPEC_DEBUG
        std::wcout << "\n";
#endif
        return tsr.index_;
    }